

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cPipelineStatisticsQueryTests.hpp
# Opt level: O3

string * glcts::PipelineStatisticsQueryUtilities::getVerifyResultValuesErrorString<int>
                   (string *__return_storage_ptr__,int value,char *value_type,uint n_expected_values
                   ,GLuint64 *expected_values,GLenum query_type,string *draw_call_type_name,
                   string *primitive_type_name,bool is_primitive_restart_enabled)

{
  char *pcVar1;
  size_t sVar2;
  ostream *poVar3;
  GLenum value_00;
  ulong uVar4;
  stringstream log_sstream;
  string local_1d8;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [376];
  
  std::__cxx11::stringstream::stringstream(local_1b8);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"Invalid default ",0x10);
  if (value_type == (char *)0x0) {
    std::ios::clear((int)(ostream *)local_1a8 + (int)*(_func_int **)(local_1a8._0_8_ + -0x18));
  }
  else {
    sVar2 = strlen(value_type);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,value_type,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8," query result value: found [",0x1c);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,value);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], expected:[",0xd);
  poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)poVar3);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
  if (1 < n_expected_values) {
    uVar4 = 1;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8," or [",5);
      poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
      std::__ostream_insert<char,std::char_traits<char>>(poVar3,"]",1);
      uVar4 = uVar4 + 1;
    } while (n_expected_values != uVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,", query type:[",0xe);
  getStringForEnum_abi_cxx11_
            (&local_1d8,(PipelineStatisticsQueryUtilities *)(ulong)query_type,value_00);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a8,local_1d8._M_dataplus._M_p,local_1d8._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], GL_PRIMITIVE_RESTART mode:[",0x1e);
  pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE disabled";
  if (is_primitive_restart_enabled) {
    pcVar1 = "Rendered image with GL_SAMPLE_COVERAGE enabled";
  }
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,pcVar1 + 0x27,8 - (ulong)is_primitive_restart_enabled);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], draw call type:[",0x13);
  pcVar1 = (draw_call_type_name->_M_dataplus)._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"], primitive type:[",0x13);
  pcVar1 = (primitive_type_name->_M_dataplus)._M_p;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)poVar3 + (int)poVar3->_vptr_basic_ostream[-3]);
  }
  else {
    sVar2 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,pcVar1,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"].",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d8._M_dataplus._M_p != &local_1d8.field_2) {
    operator_delete(local_1d8._M_dataplus._M_p,local_1d8.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base((ios_base *)(local_1a8 + 0x70));
  return __return_storage_ptr__;
}

Assistant:

static std::string getVerifyResultValuesErrorString(VALUE_TYPE value, const char* value_type,
														unsigned int		 n_expected_values,
														const glw::GLuint64* expected_values, glw::GLenum query_type,
														std::string draw_call_type_name,
														std::string primitive_type_name,
														bool		is_primitive_restart_enabled)
	{
		std::stringstream log_sstream;

		DE_ASSERT(expected_values != DE_NULL);

		log_sstream << "Invalid default " << value_type << " query result value: found "
														   "["
					<< value << "], expected:"
								"["
					<< expected_values[0] << "]";

		for (unsigned int i = 1; i < n_expected_values; ++i)
		{
			log_sstream << " or [" << expected_values[i] << "]";
		}

		log_sstream << ", query type:"
					   "["
					<< getStringForEnum(query_type) << "], "
													   "GL_PRIMITIVE_RESTART mode:"
													   "["
					<< ((is_primitive_restart_enabled) ? "enabled" : "disabled") << "]"
																					", draw call type:"
																					"["
					<< draw_call_type_name.c_str() << "]"
													  ", primitive type:"
													  "["
					<< primitive_type_name.c_str() << "].";

		return log_sstream.str();
	}